

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

int http_conn_set_error(nng_http *conn,nng_http_status status,char *reason,char *body,char *redirect
                       )

{
  uint uVar1;
  nng_err nVar2;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char local_448 [8];
  char content [1024];
  
  conn->iserr = true;
  nni_http_set_status(conn,status,reason);
  __s = nni_http_get_reason(conn);
  if (body == (char *)0x0) {
    body = local_448;
    snprintf(body,0x400,
             "<!DOCTYPE html>\n<html><head><title>%d %s</title>\n<style>body { font-family: Arial, sans serif; text-align: center }\nh1 { font-size: 36px; }span { background-color: gray; color: white; padding: 7px; border-radius: 5px }h2 { font-size: 24px; }p { font-size: 20px; }</style></head><body><p>&nbsp;</p><h1><span>%d</span></h1><h2>%s</h2><p>"
             ,(ulong)status,__s,(ulong)status,__s);
    sVar3 = strlen(body);
    sVar5 = 0x400 - sVar3;
    if (redirect != (char *)0x0) {
      sVar4 = strlen(redirect);
      if ((sVar4 < 0xc9) || (sVar4 = strlen(__s), 0x27 < sVar4)) {
        snprintf(local_448 + sVar3,sVar5,
                 "You should be automatically redirected to <a href=\"%s\">%s</a>.",redirect,
                 redirect);
      }
      else {
        snprintf(local_448 + sVar3,sVar5,"You should be automatically redirected.");
      }
      sVar5 = strlen(local_448);
      sVar5 = 0x400 - sVar5;
    }
    sVar3 = strlen(body);
    uVar1 = snprintf(local_448 + sVar3,sVar5,"%s","</p></body></html>");
    __s = (char *)(ulong)uVar1;
  }
  nVar2 = (nng_err)__s;
  if (*body != '\0') {
    nni_http_set_content_type(conn,"text/html; charset=UTF-8");
    sVar3 = strlen(body);
    nVar2 = nni_http_copy_body(conn,body,sVar3);
  }
  return nVar2;
}

Assistant:

static int
http_conn_set_error(nng_http *conn, nng_http_status status, const char *reason,
    const char *body, const char *redirect)
{
	char        content[1024];
	const char *prefix = "<!DOCTYPE html>\n"
	                     "<html><head><title>%d %s</title>\n"
	                     "<style>"
	                     "body { font-family: Arial, sans serif; "
	                     "text-align: center }\n"
	                     "h1 { font-size: 36px; }"
	                     "span { background-color: gray; color: white; "
	                     "padding: 7px; "
	                     "border-radius: 5px }"
	                     "h2 { font-size: 24px; }"
	                     "p { font-size: 20px; }"
	                     "</style></head>"
	                     "<body><p>&nbsp;</p>"
	                     "<h1><span>%d</span></h1>"
	                     "<h2>%s</h2><p>";
	const char *suffix = "</p></body></html>";

	conn->iserr = true;

	nni_http_set_status(conn, status, reason);
	reason = nni_http_get_reason(conn);

	if (body == NULL) {
		snprintf(content, sizeof(content), prefix, status, reason,
		    status, reason);
		size_t avail = sizeof(content) - strlen(content);

		if (redirect != NULL && strlen(redirect) > 200 &&
		    strlen(reason) < 40) {
			// URL is too long for buffer and unlikely to be useful
			// to humans anyway.  600 bytes will fit in the 1K
			// buffer without issue.  (Our prelude and trailer are
			// less than 400 bytes.)
			snprintf(content + strlen(content), avail,
			    "You should be automatically redirected.");
			avail = sizeof(content) - strlen(content);
		} else if (redirect != NULL) {
			// TODO: redirect should be URL encoded.
			snprintf(content + strlen(content), avail,
			    "You should be automatically redirected to <a "
			    "href=\"%s\">%s</a>.",
			    redirect, redirect);
			avail = sizeof(content) - strlen(content);
		}
		snprintf(content + strlen(content), avail, "%s", suffix);
		body = content;
	}
	if (strlen(body) > 0) {
		nni_http_set_content_type(conn, "text/html; charset=UTF-8");
		// if the follow fails, live with it (ENOMEM, so no body).
		(void) nni_http_copy_body(conn, body, strlen(body));
	}
	return (0);
}